

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.h
# Opt level: O3

void yyml::nn::SubstractBackward<double>
               (Variable<double> *va,Variable<double> *vb,Variable<double> *result)

{
  size_t sVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  size_t sVar5;
  
  sVar1 = (result->grads_).shape_.total;
  if (sVar1 != 0) {
    pdVar2 = (result->grads_).data_;
    pdVar3 = (va->grads_).data_;
    pdVar4 = (vb->grads_).data_;
    sVar5 = 0;
    do {
      pdVar3[sVar5] = pdVar2[sVar5] + pdVar3[sVar5];
      pdVar4[sVar5] = pdVar4[sVar5] - pdVar2[sVar5];
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  Factory<yyml::nn::Variable<double>_>::RemoveInstance(result);
  return;
}

Assistant:

void SubstractBackward(Variable<Type>* va, Variable<Type>* vb,
                       Variable<Type>* result) {
  for (int i = 0; i < result->grads_.total(); i++) {
    /* dL      dL      d(upper)          dL
     * -- = -------- * ----------- =  -------- * 1
     * dx   d(upper)      dx          d(upper)
     *
     */
    va->grads_.data_[i] += result->grads_.data_[i];
    vb->grads_.data_[i] -= result->grads_.data_[i];
  }
  Variable<Type>::factory::RemoveInstance(result);
}